

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_exeWatcher.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  anon_class_32_1_c720d20e local_d8;
  function<void_(bool)> local_b8;
  undefined1 local_98 [8];
  exeWatcher ew;
  string local_38 [8];
  string file_name;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  if (argc != 2) {
    ew.call_back_func._M_invoker._0_4_ = 1;
  }
  else {
    std::__cxx11::string::operator=(local_38,argv[1]);
    std::__cxx11::string::string((string *)&local_d8,local_38);
    std::function<void(bool)>::function<main::__0,void>((function<void(bool)> *)&local_b8,&local_d8)
    ;
    wmj::fileWatcher::exeWatcher::exeWatcher((exeWatcher *)local_98,(string *)local_38,&local_b8);
    std::function<void_(bool)>::~function(&local_b8);
    main::$_0::~__0((__0 *)&local_d8);
    wmj::fileWatcher::exeWatcher::startWatch((exeWatcher *)local_98);
    wmj::fileWatcher::exeWatcher::run((exeWatcher *)local_98);
    ew.call_back_func._M_invoker._0_4_ = 1;
    wmj::fileWatcher::exeWatcher::~exeWatcher((exeWatcher *)local_98);
  }
  argv_local._4_4_ = (uint)(argc != 2);
  std::__cxx11::string::~string(local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    std::string file_name;
    if(argc == 2) {
        file_name = argv[1];
    } else {
        return 1;
    }
    wmj::fileWatcher::exeWatcher ew(file_name, [file_name](bool if_open) {
        if(if_open) {
            std::cout << file_name << " launched" << std::endl;
        } else {
            std::cout << file_name << " close" << std::endl;
        }
    });
    ew.startWatch();
    ew.run();
    return 0;
}